

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O0

ValidationPolicy validationPolicyForStateTests(void)

{
  ValidationPolicy VVar1;
  ValidationPolicy local_c [2];
  ValidationPolicy validationPolicy;
  
  CoreML::ValidationPolicy::ValidationPolicy(local_c);
  VVar1.allowsEmptyInput = true;
  VVar1.allowsEmptyOutput = true;
  VVar1.allowsMultipleFunctions = true;
  VVar1.allowsStatefulPrediction = true;
  return VVar1;
}

Assistant:

static ValidationPolicy validationPolicyForStateTests() {
    auto validationPolicy = ValidationPolicy();
    validationPolicy.allowsEmptyInput = true;
    validationPolicy.allowsEmptyOutput = true;
    validationPolicy.allowsMultipleFunctions = true;
    validationPolicy.allowsStatefulPrediction = true;
    return validationPolicy;
}